

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

ChunkHeader * __thiscall
Compressor::encodeChunk
          (Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *output,
          Image *input,MaskRect bounds,Point location,bool isSwitch)

{
  bool bVar1;
  Size this_00;
  const_iterator cVar2;
  const_iterator cVar3;
  Image *pIVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  value_type *pvVar6;
  size_type sVar7;
  uchar *input_00;
  Size *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  long *in_RSI;
  ChunkHeader *in_RDI;
  undefined8 in_R9;
  byte in_stack_00000008;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *img_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *img;
  int p2;
  int p1;
  bool hasTransparent;
  Image sized;
  ChunkHeader *header;
  vector<Color,_std::allocator<Color>_> *in_stack_fffffffffffffec8;
  uint8_t *in_stack_fffffffffffffed0;
  value_type *in_stack_fffffffffffffed8;
  Image *in_stack_fffffffffffffee0;
  Image *in_stack_fffffffffffffef8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  pointer p2_00;
  pointer p1_00;
  Image *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar8;
  Size *palette;
  Image *in_stack_ffffffffffffff58;
  Impl *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Size in_stack_ffffffffffffffa8;
  uint16_t local_18;
  uint16_t uStack_14;
  
  palette = in_RCX;
  this_00 = align(*in_RCX);
  Image::resizeClampToEdge((Image *)this_00,in_stack_ffffffffffffffa8);
  if ((in_stack_00000008 & 1) == 0) {
    swapBR(in_stack_fffffffffffffee0);
  }
  in_RDI->type = TYPE_COLOR1;
  p2_00 = (pointer)0x0;
  p1_00 = (pointer)0x0;
  (in_RDI->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)0x10ad1f);
  (in_RDI->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_start = p2_00;
  (in_RDI->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_finish = p1_00;
  (in_RDI->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)0x10ad41);
  in_RDI->alignmentWords = 0;
  in_RDI->x = 0;
  in_RDI->y = 0;
  in_RDI->w = 0;
  in_RDI->h = 0;
  in_RDI->size = 0;
  local_18 = (uint16_t)in_R9;
  in_RDI->x = local_18;
  uStack_14 = (uint16_t)((ulong)in_R9 >> 0x20);
  in_RDI->y = uStack_14;
  in_RDI->w = (uint16_t)in_RCX->width;
  in_RDI->h = (uint16_t)in_RCX->height;
  in_RDI->size = 0;
  cVar2 = std::vector<Color,_std::allocator<Color>_>::begin(in_stack_fffffffffffffec8);
  cVar3 = std::vector<Color,_std::allocator<Color>_>::end(in_stack_fffffffffffffec8);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<Color_const*,std::vector<Color,std::allocator<Color>>>,Compressor::encodeChunk(std::vector<unsigned_char,std::allocator<unsigned_char>>&,Image_const&,MaskRect,Point,bool)::__0>
                    (cVar2._M_current,cVar3._M_current);
  uVar8 = bVar1;
  if (bVar1) {
    std::vector<MaskRect,_std::allocator<MaskRect>_>::push_back
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
  }
  else {
    std::vector<MaskRect,_std::allocator<MaskRect>_>::push_back
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
  }
  Impl::getPalettes((Impl *)CONCAT17(uVar8,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28,
                    (int *)p1_00,(int *)p2_00);
  if (-1 < in_stack_ffffffffffffff70) {
    in_stack_ffffffffffffff60 =
         (Impl *)Impl::writePaletted(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                     (unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
                                      *)palette,SUB81((ulong)in_RSI >> 0x38,0));
    in_stack_ffffffffffffff00 = in_RDX;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10aee7);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60);
    compress((Compressor *)in_stack_fffffffffffffee0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    in_stack_fffffffffffffef8 =
         (Image *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_ffffffffffffff60);
    pIVar4 = (Image *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
    if (in_stack_fffffffffffffef8 < pIVar4) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    else {
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
      in_RDI->size = (uint32_t)sVar7;
    }
    in_RDI->type = TYPE_INDEXED;
  }
  if ((-1 < in_stack_ffffffffffffff6c) && (bVar1)) {
    pvVar5 = Impl::writePaletted(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                 (unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
                                  *)palette,SUB81((ulong)in_RSI >> 0x38,0));
    in_stack_fffffffffffffee0 = (Image *)(*in_RSI + 0x70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10affd);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar5);
    compress((Compressor *)in_stack_fffffffffffffee0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffee0);
    if (!bVar1) {
      in_stack_fffffffffffffed8 =
           (value_type *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
      pvVar6 = (value_type *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(*in_RSI + 0x70))
      ;
      if (in_stack_fffffffffffffed8 <= pvVar6) goto LAB_0010b0bb;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
    in_RDI->size = (uint32_t)sVar7;
    in_RDI->type = TYPE_INDEXED_ALPHA;
  }
LAB_0010b0bb:
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffee0);
  if (bVar1) {
    prepareWriteRGB(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    pvVar5 = in_RDX;
    input_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10b10f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(*in_RSI + 0x70));
    compress((Compressor *)in_stack_fffffffffffffee0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed8,
             input_00,(int)((ulong)pvVar5 >> 0x20),SUB81((ulong)pvVar5 >> 0x18,0));
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
    in_RDI->size = (uint32_t)sVar7;
    in_RDI->type = TYPE_COLOR;
  }
  Image::~Image((Image *)0x10b198);
  return in_RDI;
}

Assistant:

ChunkHeader Compressor::encodeChunk(std::vector<uint8_t>& output, const Image& input, MaskRect bounds, Point location, bool isSwitch) {
	Image sized = input.resizeClampToEdge(align(input.size));
	if (!isSwitch) {
		swapBR(sized);
	}
	ChunkHeader header = {};
	header.x = location.x;
	header.y = location.y;
	header.w = input.size.width;
	header.h = input.size.height;
	header.size = 0;
	bool hasTransparent = std::any_of(input.colorData.begin(), input.colorData.end(), [](Color c){ return c.a != 255; });
	if (hasTransparent) {
		header.transparentMasks.push_back(bounds);
	} else {
		header.masks.push_back(bounds);
	}
	int p1, p2;
	impl->getPalettes(sized, p1, p2);
	if (p1 >= 0) {
		auto& img = impl->writePaletted(sized, impl->palette1, false);
		compress(output, img.data(), static_cast<int>(img.size()), isSwitch);
		if (img.size() < output.size()) {
			output = img;
		} else {
			header.size = output.size();
		}
		header.type = ChunkHeader::TYPE_INDEXED;
	}
	if (p2 >= 0 && hasTransparent) {
		auto& img = impl->writePaletted(sized, impl->palette2, true);
		compress(impl->scratch, img.data(), static_cast<int>(img.size()), isSwitch);
		if (output.empty() || output.size() > impl->scratch.size()) {
			output = impl->scratch;
			header.size = output.size();
			header.type = ChunkHeader::TYPE_INDEXED_ALPHA;
		}
	}

	if (output.empty()) {
		prepareWriteRGB(impl->scratch, sized);
		compress(output, impl->scratch.data(), impl->scratch.size(), isSwitch);
		header.size = output.size();
		header.type = ChunkHeader::TYPE_COLOR;
	}

	return header;
}